

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::SpecifyBlockSyntax::SpecifyBlockSyntax
          (SpecifyBlockSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token specify,SyntaxList<slang::syntax::MemberSyntax> *items,Token endspecify)

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  long lVar7;
  
  uVar6 = specify._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = SpecifyBlock;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->specify).kind = (short)uVar6;
  (this->specify).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->specify).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->specify).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->specify).info = specify.info;
  SVar4 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar1 = (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b010;
  (this->endspecify).kind = endspecify.kind;
  (this->endspecify).field_0x2 = endspecify._2_1_;
  (this->endspecify).numFlags = (NumericTokenFlags)endspecify.numFlags.raw;
  (this->endspecify).rawLen = endspecify.rawLen;
  (this->endspecify).info = endspecify.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppMVar3 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppMVar3 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  return;
}

Assistant:

SpecifyBlockSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token specify, const SyntaxList<MemberSyntax>& items, Token endspecify) :
        MemberSyntax(SyntaxKind::SpecifyBlock, attributes), specify(specify), items(items), endspecify(endspecify) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }